

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Cond * skiwi::make_cond(Cond *__return_storage_ptr__,
                       vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  e_type eVar4;
  reference pvVar5;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_00;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_01;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_02;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_03;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX_00;
  reference rVar6;
  allocator<char> local_539;
  string local_538;
  Expression local_518;
  allocator<char> local_421;
  string local_420;
  Expression local_400;
  allocator<char> local_309;
  string local_308;
  reference local_2e8;
  string local_2d8;
  True local_2b8;
  variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_278;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  local_210;
  string local_120;
  byte local_f9;
  undefined1 local_f8 [7];
  bool rlsb;
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  expr;
  string local_d8;
  string local_b8;
  byte local_92;
  allocator<char> local_91;
  undefined1 local_90 [6];
  bool else_statement;
  undefined1 local_70 [8];
  string name;
  allocator<char> local_39;
  string local_38;
  _anonymous_namespace_ *local_18;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_local;
  Cond *c;
  
  local_18 = (_anonymous_namespace_ *)tokens;
  tokens_local = (vector<skiwi::token,_std::allocator<skiwi::token>_> *)__return_storage_ptr__;
  bVar3 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::empty(tokens);
  if (bVar3) {
    anon_unknown_2::throw_parse_error(no_tokens);
  }
  eVar4 = anon_unknown_2::current_type
                    ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  if (eVar4 != T_ID) {
    pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar1 = pvVar5->line_nr;
    pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar2 = pvVar5->column_nr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    anon_unknown_2::throw_parse_error(iVar1,iVar2,bad_syntax,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  name.field_2._M_local_buf[0xb] = '\0';
  Cond::Cond(__return_storage_ptr__);
  pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  __return_storage_ptr__->line_nr = pvVar5->line_nr;
  pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  __return_storage_ptr__->column_nr = pvVar5->column_nr;
  (anonymous_namespace)::current_abi_cxx11_((string *)local_70,local_18,tokens_00);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_70,"cond");
  if (bVar3) {
    pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar1 = pvVar5->line_nr;
    pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar2 = pvVar5->column_nr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"cond",&local_91);
    anon_unknown_2::throw_parse_error(iVar1,iVar2,expected_keyword,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  anon_unknown_2::advance((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  local_92 = 0;
  tokens_01 = extraout_RDX;
  while( true ) {
    (anonymous_namespace)::current_abi_cxx11_(&local_b8,local_18,tokens_01);
    bVar3 = std::operator!=(&local_b8,")");
    std::__cxx11::string::~string((string *)&local_b8);
    if (!bVar3) break;
    std::vector<bool,_std::allocator<bool>_>::push_back(&__return_storage_ptr__->is_proc,false);
    if ((local_92 & 1) != 0) {
      iVar1 = __return_storage_ptr__->line_nr;
      iVar2 = __return_storage_ptr__->column_nr;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,")",
                 (allocator<char> *)
                 ((long)&expr.
                         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      anon_unknown_2::throw_parse_error(iVar1,iVar2,expected_keyword,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&expr.
                         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    std::
    vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
    ::vector((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
              *)local_f8);
    local_f9 = anon_unknown_2::require_left_square_bracket
                         ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    while( true ) {
      bVar3 = anon_unknown_2::closing_brackets
                        ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      (anonymous_namespace)::current_abi_cxx11_(&local_120,local_18,tokens_02);
      bVar3 = std::operator==(&local_120,"else");
      std::__cxx11::string::~string((string *)&local_120);
      if (bVar3) {
        anon_unknown_2::advance((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
        local_92 = 1;
        True::True(&local_2b8);
        std::
        variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
        ::variant<skiwi::True,void,void,skiwi::True,void>
                  ((variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
                    *)&local_278,&local_2b8);
        std::
        variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
        ::
        variant<std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,void,void,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,void>
                  ((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                    *)&local_210,&local_278);
        std::
        vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
        ::push_back((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                     *)local_f8,(value_type *)&local_210);
        std::
        variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        ::~variant(&local_210);
        std::
        variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
        ::~variant(&local_278);
        True::~True(&local_2b8);
      }
      else {
        (anonymous_namespace)::current_abi_cxx11_(&local_2d8,local_18,tokens_03);
        bVar3 = std::operator==(&local_2d8,"=>");
        std::__cxx11::string::~string((string *)&local_2d8);
        if (bVar3) {
          rVar6 = std::vector<bool,_std::allocator<bool>_>::back(&__return_storage_ptr__->is_proc);
          local_2e8 = rVar6;
          std::_Bit_reference::operator=(&local_2e8,true);
          anon_unknown_2::advance((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
          bVar3 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::empty
                            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
          if (bVar3) {
            iVar1 = __return_storage_ptr__->line_nr;
            iVar2 = __return_storage_ptr__->column_nr;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"",&local_309);
            anon_unknown_2::throw_parse_error(iVar1,iVar2,no_tokens,&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::allocator<char>::~allocator(&local_309);
          }
          make_expression(&local_400,(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18
                         );
          std::
          vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
          ::push_back((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                       *)local_f8,&local_400);
          std::
          variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
          ::~variant(&local_400);
          bVar3 = anon_unknown_2::closing_brackets
                            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
          if (!bVar3) {
            iVar1 = __return_storage_ptr__->line_nr;
            iVar2 = __return_storage_ptr__->column_nr;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"]",&local_421);
            anon_unknown_2::throw_parse_error(iVar1,iVar2,expected_keyword,&local_420);
            std::__cxx11::string::~string((string *)&local_420);
            std::allocator<char>::~allocator(&local_421);
          }
        }
        else {
          make_expression(&local_518,(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18
                         );
          std::
          vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
          ::push_back((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                       *)local_f8,&local_518);
          std::
          variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
          ::~variant(&local_518);
          bVar3 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::empty
                            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
          if (bVar3) {
            iVar1 = __return_storage_ptr__->line_nr;
            iVar2 = __return_storage_ptr__->column_nr;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"]",&local_539);
            anon_unknown_2::throw_parse_error(iVar1,iVar2,expected_keyword,&local_538);
            std::__cxx11::string::~string((string *)&local_538);
            std::allocator<char>::~allocator(&local_539);
          }
        }
      }
    }
    anon_unknown_2::require_right_square_bracket
              ((bool)(local_f9 & 1),(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18)
    ;
    std::
    vector<std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>,_std::allocator<std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
    ::push_back(&__return_storage_ptr__->arguments,(value_type *)local_f8);
    std::
    vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
    ::~vector((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               *)local_f8);
    tokens_01 = extraout_RDX_00;
  }
  name.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::~string((string *)local_70);
  if ((name.field_2._M_local_buf[0xb] & 1U) == 0) {
    Cond::~Cond(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Cond make_cond(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  Cond c;
  c.line_nr = tokens.back().line_nr;
  c.column_nr = tokens.back().column_nr;
  std::string name = current(tokens);
  if (name != "cond")
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, expected_keyword, "cond");
  advance(tokens);
  bool else_statement = false;
  while (current(tokens) != ")")
    {
    c.is_proc.push_back(false);
    if (else_statement)
      throw_parse_error(c.line_nr, c.column_nr, expected_keyword, ")");
    std::vector<Expression> expr;
    //require(tokens, "[");
    bool rlsb = require_left_square_bracket(tokens);
    while (!closing_brackets(tokens))
      {
      if (current(tokens) == "else")
        {
        advance(tokens);
        else_statement = true;
        expr.push_back(Expression(Literal(True())));
        }
      else
        {
        if (current(tokens) == "=>")
          {
          c.is_proc.back() = true;
          advance(tokens);
          if (tokens.empty())
            throw_parse_error(c.line_nr, c.column_nr, no_tokens);
          expr.push_back(make_expression(tokens));
          if (!closing_brackets(tokens))
            throw_parse_error(c.line_nr, c.column_nr, expected_keyword, "]");
          }
        else
          {
          expr.push_back(make_expression(tokens));
          if (tokens.empty())
            throw_parse_error(c.line_nr, c.column_nr, expected_keyword, "]");
          }
        }
      }
    //advance(tokens);
    require_right_square_bracket(rlsb, tokens);
    c.arguments.push_back(expr);
    }
  return c;
  }